

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.h
# Opt level: O2

XmlRpcValue * __thiscall XmlRpc::XmlRpcValue::operator[](XmlRpcValue *this,int i)

{
  reference pvVar1;
  
  XmlRpc::XmlRpcValue::assertArray((int)this);
  pvVar1 = std::vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_>::at
                     ((vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_> *)
                      (this->_value).asTime,(long)i);
  return pvVar1;
}

Assistant:

XmlRpcValue& operator[](int i)             { assertArray(i+1); return _value.asArray->at(i); }